

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  long *plVar1;
  int iVar2;
  Controller *this;
  bool bVar3;
  allocator<char> local_b9;
  long *local_b8;
  long *local_b0;
  long *local_a8;
  long *local_a0;
  long *local_98;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  Tools::getInstance();
  Logger::getInstance();
  local_b0 = (long *)operator_new(0x20);
  local_a0 = local_b0 + 2;
  *local_b0 = (long)local_a0;
  local_b0[1] = 0;
  *(undefined1 *)(local_b0 + 2) = 0;
  local_b8 = (long *)operator_new(0x20);
  local_98 = local_b8 + 2;
  *local_b8 = (long)local_98;
  local_b8[1] = 0;
  *(undefined1 *)(local_b8 + 2) = 0;
  local_a8 = (long *)operator_new(0x20);
  *local_a8 = (long)(local_a8 + 2);
  local_a8[1] = 0;
  *(undefined1 *)(local_a8 + 2) = 0;
  bVar3 = true;
  do {
    plVar1 = local_b0;
    std::__istream_extract((istream *)&std::cin,(char *)*local_b0,0x7fffffffffffffff);
    std::__istream_extract((istream *)&std::cin,(char *)*local_b8,0x7fffffffffffffff);
    std::__istream_extract((istream *)&std::cin,(char *)*local_a8,0x7fffffffffffffff);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,(char *)*plVar1,&local_b9)
    ;
    iVar2 = std::__cxx11::string::compare((char *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (iVar2 == 0) {
      bVar3 = false;
    }
    this = (Controller *)operator_new(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,(char *)*local_b8,(allocator<char> *)local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,(char *)*local_a8,&local_b9);
    Controller::Controller(this,&local_70,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  } while (bVar3);
  if ((long *)*local_b0 != local_a0) {
    operator_delete((long *)*local_b0,*local_a0 + 1);
  }
  operator_delete(local_b0,0x20);
  if ((long *)*local_b8 != local_98) {
    operator_delete((long *)*local_b8,*local_98 + 1);
  }
  operator_delete(local_b8,0x20);
  (*(this->
    super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._vptr_ControllerBase[3])(this);
  return 0;
}

Assistant:

int main() {
    Tools *tools = Tools::getInstance();
    Logger *logger = Logger::getInstance();
    string *name = new string();
    string *operation = new string();
    string *argument = new string();
    bool choice = true;
    Controller *controller;
    while (choice) {
        cin >> name->data() >> operation->data() >> argument->data();
        if (string(name->data()) == "ex") {
            choice = false;
        }
        controller = new Controller(operation->data(), argument->data());
    }

    delete name;
    delete operation;
    delete controller;

    return 0;
}